

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

int divideby(int M,int d)

{
  int local_10;
  int d_local;
  int M_local;
  
  for (local_10 = M; local_10 % d == 0; local_10 = local_10 / d) {
  }
  d_local = (int)(local_10 == 1);
  return d_local;
}

Assistant:

int divideby(int M,int d) {
	while (M%d == 0) {
		M = M/d;
	}
	if (M == 1) {
		return 1;
	}
	 return 0;
}